

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::analogies(FastText *this,int32_t k)

{
  pointer ppVar1;
  ostream *poVar2;
  pointer ppVar3;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  results;
  string wordC;
  string wordA;
  string wordB;
  string prompt;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,"Query triplet (A - B + C)? ",(allocator *)&local_90);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_90._M_string_length = 0;
  local_70._M_string_length = 0;
  local_b0._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  local_b0.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,local_50);
  do {
    std::operator>>((istream *)&std::cin,(string *)&local_90);
    std::operator>>((istream *)&std::cin,(string *)&local_70);
    std::operator>>((istream *)&std::cin,(string *)&local_b0);
    getAnalogies(&local_c8,this,k,&local_90,&local_70,&local_b0);
    ppVar1 = local_c8.
             super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = local_c8.
                  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&ppVar3->second);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->first);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::operator<<((ostream *)&std::cout,local_50);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_c8);
  } while( true );
}

Assistant:

void FastText::analogies(int32_t k) {
	std::string prompt("Query triplet (A - B + C)? ");
	std::string wordA, wordB, wordC;
	std::cout << prompt;
	while (true) {
		std::cin >> wordA;
		std::cin >> wordB;
		std::cin >> wordC;
		auto results = getAnalogies(k, wordA, wordB, wordC);

		for (auto& pair : results) {
			std::cout << pair.second << " " << pair.first << std::endl;
		}
		std::cout << prompt;
	}
}